

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int arkLsDQJac(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix Jac,void *arkode_mem,N_Vector tmp1,
              N_Vector tmp2,N_Vector tmp3)

{
  N_Vector_Ops p_Var1;
  int iVar2;
  ARKRhsFn fi;
  int error_code;
  char *msgfmt;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  
  iVar2 = arkLs_AccessARKODELMem(arkode_mem,"arkLsDQJac",&ark_mem,&arkls_mem);
  if (iVar2 != 0) {
    return iVar2;
  }
  if (Jac == (SUNMatrix)0x0) {
    msgfmt = "SUNMatrix is NULL";
    error_code = -2;
    iVar2 = 0xa15;
  }
  else {
    fi = (*ark_mem->step_getimplicitrhs)(ark_mem);
    if (fi == (ARKRhsFn)0x0) {
      msgfmt = "Time step module is missing implicit RHS fcn";
      error_code = -3;
      iVar2 = 0xa1e;
    }
    else {
      p_Var1 = ark_mem->tempv1->ops;
      if ((((p_Var1->nvcloneempty == (_func_N_Vector_N_Vector *)0x0) ||
           (p_Var1->nvwrmsnorm == (_func_sunrealtype_N_Vector_N_Vector *)0x0)) ||
          (p_Var1->nvlinearsum ==
           (_func_void_sunrealtype_N_Vector_sunrealtype_N_Vector_N_Vector *)0x0)) ||
         (((p_Var1->nvdestroy == (_func_void_N_Vector *)0x0 ||
           (p_Var1->nvscale == (_func_void_sunrealtype_N_Vector_N_Vector *)0x0)) ||
          ((p_Var1->nvgetarraypointer == (_func_sunrealtype_ptr_N_Vector *)0x0 ||
           (p_Var1->nvsetarraypointer == (_func_void_sunrealtype_ptr_N_Vector *)0x0)))))) {
        msgfmt = "A required vector operation is not implemented.";
        error_code = -3;
        iVar2 = 0xa2c;
      }
      else {
        iVar2 = SUNMatGetID(Jac);
        if (iVar2 == 0) {
          iVar2 = arkLsDenseDQJac(t,y,fy,Jac,ark_mem,arkls_mem,fi,tmp1);
          return iVar2;
        }
        iVar2 = SUNMatGetID(Jac);
        if (iVar2 == 3) {
          iVar2 = arkLsBandDQJac(t,y,fy,Jac,ark_mem,arkls_mem,fi,tmp1,tmp2);
          return iVar2;
        }
        msgfmt = "arkLsDQJac not implemented for this SUNMatrix type!";
        error_code = -3;
        iVar2 = 0xa3c;
      }
    }
  }
  arkProcessError(ark_mem,error_code,iVar2,"arkLsDQJac",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int arkLsDQJac(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix Jac,
               void* arkode_mem, N_Vector tmp1, N_Vector tmp2,
               SUNDIALS_MAYBE_UNUSED N_Vector tmp3)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  ARKRhsFn fi;
  int retval;

  /* access ARKodeMem and ARKLsMem structures */
  retval = arkLs_AccessARKODELMem(arkode_mem, __func__, &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* verify that Jac is non-NULL */
  if (Jac == NULL)
  {
    arkProcessError(ark_mem, ARKLS_LMEM_NULL, __LINE__, __func__, __FILE__,
                    "SUNMatrix is NULL");
    return (ARKLS_LMEM_NULL);
  }

  /* Access implicit RHS function */
  fi = ark_mem->step_getimplicitrhs((void*)ark_mem);
  if (fi == NULL)
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Time step module is missing implicit RHS fcn");
    return (ARKLS_ILL_INPUT);
  }

  /* Verify that N_Vector supports required routines */
  if (ark_mem->tempv1->ops->nvcloneempty == NULL ||
      ark_mem->tempv1->ops->nvwrmsnorm == NULL ||
      ark_mem->tempv1->ops->nvlinearsum == NULL ||
      ark_mem->tempv1->ops->nvdestroy == NULL ||
      ark_mem->tempv1->ops->nvscale == NULL ||
      ark_mem->tempv1->ops->nvgetarraypointer == NULL ||
      ark_mem->tempv1->ops->nvsetarraypointer == NULL)
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_LS_BAD_NVECTOR);
    return (ARKLS_ILL_INPUT);
  }

  /* Call the matrix-structure-specific DQ approximation routine */
  if (SUNMatGetID(Jac) == SUNMATRIX_DENSE)
  {
    retval = arkLsDenseDQJac(t, y, fy, Jac, ark_mem, arkls_mem, fi, tmp1);
  }
  else if (SUNMatGetID(Jac) == SUNMATRIX_BAND)
  {
    retval = arkLsBandDQJac(t, y, fy, Jac, ark_mem, arkls_mem, fi, tmp1, tmp2);
  }
  else
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "arkLsDQJac not implemented for this SUNMatrix type!");
    retval = ARKLS_ILL_INPUT;
  }
  return (retval);
}